

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O2

void jpc_qmfb_split_row(jpc_fix_t *a,uint numcols,uint parity)

{
  jpc_fix_t *ptr;
  long lVar1;
  int iVar2;
  jpc_fix_t *pjVar3;
  uint uVar4;
  bool bVar5;
  jpc_fix_t splitbuf [4096];
  
  ptr = splitbuf;
  uVar4 = numcols + 1;
  if (uVar4 < 0x2002) {
    if (numcols < 2) {
      return;
    }
  }
  else {
    ptr = (jpc_fix_t *)jas_alloc2((ulong)(uVar4 >> 1),8);
    if (ptr == (jpc_fix_t *)0x0) {
      abort();
    }
  }
  uVar4 = uVar4 - parity >> 1;
  pjVar3 = a + (1 - parity);
  for (lVar1 = 0; numcols - uVar4 != (int)lVar1; lVar1 = lVar1 + 1) {
    *(jpc_fix_t *)((long)ptr + lVar1 * 8) = *pjVar3;
    pjVar3 = pjVar3 + 2;
  }
  iVar2 = uVar4 - (parity == 0);
  lVar1 = 0;
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    *(undefined8 *)((long)(a + (1 - parity)) + lVar1) =
         *(undefined8 *)((long)a + lVar1 * 2 + (ulong)(2 - parity) * 8);
    lVar1 = lVar1 + 8;
  }
  for (lVar1 = 0; numcols - uVar4 != (int)lVar1; lVar1 = lVar1 + 1) {
    a[(ulong)uVar4 + lVar1] = *(jpc_fix_t *)((long)ptr + lVar1 * 8);
  }
  if (ptr != splitbuf) {
    jas_free(ptr);
  }
  return;
}

Assistant:

static void jpc_qmfb_split_row(jpc_fix_t *a, unsigned numcols, unsigned parity)
{
	jpc_fix_t splitbuf[QMFB_SPLITBUFSIZE];
	jpc_fix_t *buf = splitbuf;
	register jpc_fix_t *srcptr;
	register jpc_fix_t *dstptr;

	/* Get a buffer. */
	const size_t bufsize = JPC_CEILDIVPOW2(numcols, 1);
	if (bufsize > QMFB_SPLITBUFSIZE) {
		if (!(buf = jas_alloc2(bufsize, sizeof(jpc_fix_t)))) {
			/* We have no choice but to commit suicide in this case. */
			abort();
		}
	}

	if (numcols >= 2) {
		const unsigned hstartcol = (numcols + 1 - parity) >> 1;
		// ORIGINAL (WRONG): m = (parity) ? hstartcol : (numcols - hstartcol);
		const unsigned m = numcols - hstartcol;

		/* Save the samples destined for the highpass channel. */
		dstptr = buf;
		srcptr = &a[1 - parity];
		for (unsigned n = m; n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			srcptr += 2;
		}
		/* Copy the appropriate samples into the lowpass channel. */
		dstptr = &a[1 - parity];
		srcptr = &a[2 - parity];
		for (unsigned n = numcols - m - (!parity); n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			srcptr += 2;
		}
		/* Copy the saved samples into the highpass channel. */
		dstptr = &a[hstartcol];
		srcptr = buf;
		for (unsigned n = m; n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			++srcptr;
		}
	}

	/* If the split buffer was allocated on the heap, free this memory. */
	if (buf != splitbuf) {
		jas_free(buf);
	}

}